

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

void Aig_ManRegManStop(Aig_ManPre_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  Vec_Flt_t *__ptr;
  long lVar4;
  
  pVVar1 = p->vMatrix;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar4];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vParts;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar4 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar4];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar3 = p->vRegs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vUniques;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vFreeVars;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  __ptr = p->vPartCost;
  if (__ptr->pArray != (float *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (float *)0x0;
  }
  if (__ptr != (Vec_Flt_t *)0x0) {
    free(__ptr);
  }
  if (p->pfUsedRegs != (char *)0x0) {
    free(p->pfUsedRegs);
    p->pfUsedRegs = (char *)0x0;
  }
  if (p->pfPartVars != (char *)0x0) {
    free(p->pfPartVars);
    p->pfPartVars = (char *)0x0;
  }
  if (p != (Aig_ManPre_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Aig_ManRegManStop( Aig_ManPre_t * p )
{
    Vec_VecFree( (Vec_Vec_t *)p->vMatrix );
    if ( p->vParts )
        Vec_VecFree( (Vec_Vec_t *)p->vParts );
    Vec_IntFree( p->vRegs );
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vFreeVars );
    Vec_FltFree( p->vPartCost );
    ABC_FREE( p->pfUsedRegs );
    ABC_FREE( p->pfPartVars );
    ABC_FREE( p );
}